

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpermutation.cpp
# Opt level: O1

void __thiscall TPZPermutation::TPZPermutation(TPZPermutation *this,int n)

{
  int *piVar1;
  undefined1 auVar2 [16];
  uint in_EAX;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 local_28;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZPermutation_0183b0d8;
  local_28 = (ulong)in_EAX;
  TPZManVector<int,_10>::TPZManVector(&this->fCounter,(long)n,(int *)((long)&local_28 + 4));
  local_28 = CONCAT44(local_28._4_4_,0xffffffff);
  TPZManVector<int,_10>::TPZManVector(&this->fOrder,(long)n,(int *)&local_28);
  auVar2 = _DAT_014f8350;
  if (0 < n) {
    piVar1 = (this->fOrder).super_TPZVec<int>.fStore;
    lVar3 = (ulong)(uint)n - 1;
    auVar5._8_4_ = (int)lVar3;
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_014f8350;
    auVar6 = _DAT_014f8340;
    do {
      auVar7 = auVar6 ^ auVar2;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        piVar1[uVar4] = (int)uVar4;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        piVar1[uVar4 + 1] = (int)uVar4 + 1;
      }
      uVar4 = uVar4 + 2;
      lVar3 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar3 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar4);
  }
  return;
}

Assistant:

TPZPermutation::TPZPermutation(int n) : fCounter(n,0), fOrder(n,-1)
{
	int i;
	for(i=0; i<n; i++) fOrder[i] = i;
}